

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::cmMakefile
          (cmMakefile *this,cmGlobalGenerator *globalGenerator,cmStateSnapshot *snapshot)

{
  _Rb_tree_header *p_Var1;
  cmStateSnapshot *this_00;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  cmState *this_01;
  undefined1 local_b8 [16];
  undefined1 local_a8 [112];
  function<void_()> *local_38;
  
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)this,0);
  p_Var1 = &(this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Targets)._M_h._M_buckets = &(this->Targets)._M_h._M_single_bucket;
  (this->Targets)._M_h._M_bucket_count = 1;
  (this->Targets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Targets)._M_h._M_element_count = 0;
  (this->Targets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Targets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Targets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFileSearchIndex)._M_h._M_buckets =
       &(this->SourceFileSearchIndex)._M_h._M_single_bucket;
  (this->SourceFileSearchIndex)._M_h._M_bucket_count = 1;
  (this->SourceFileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SourceFileSearchIndex)._M_h._M_element_count = 0;
  (this->SourceFileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->SourceFileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->SourceFileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->KnownFileSearchIndex)._M_h._M_buckets = &(this->KnownFileSearchIndex)._M_h._M_single_bucket
  ;
  (this->KnownFileSearchIndex)._M_h._M_bucket_count = 1;
  (this->KnownFileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->KnownFileSearchIndex)._M_h._M_element_count = 0;
  (this->KnownFileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->KnownFileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->KnownFileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_a8._88_8_ = &this->ComplainFileRegularExpression;
  local_a8._104_8_ = &(this->ComplainFileRegularExpression).field_2;
  (this->TestGenerators).
  super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TestGenerators).
  super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TestGenerators).
  super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComplainFileRegularExpression)._M_dataplus._M_p = (pointer)local_a8._104_8_;
  (this->ComplainFileRegularExpression)._M_string_length = 0;
  (this->ComplainFileRegularExpression).field_2._M_local_buf[0] = '\0';
  local_a8._80_8_ = &this->DefineFlags;
  local_a8._56_8_ = &(this->DefineFlags).field_2;
  (this->DefineFlags)._M_dataplus._M_p = (pointer)local_a8._56_8_;
  (this->DefineFlags)._M_string_length = 0;
  (this->DefineFlags).field_2._M_local_buf[0] = '\0';
  local_a8._96_8_ = &(this->DefineFlagsOrig).field_2;
  (this->DefineFlagsOrig)._M_dataplus._M_p = (pointer)local_a8._96_8_;
  (this->DefineFlagsOrig)._M_string_length = 0;
  (this->DefineFlagsOrig).field_2._M_local_buf[0] = '\0';
  local_a8._64_8_ = &this->SourceGroups;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->GlobalGenerator = globalGenerator;
  (this->StateSnapshot).Position.Position = (snapshot->Position).Position;
  pcVar2 = (snapshot->Position).Tree;
  (this->StateSnapshot).State = snapshot->State;
  (this->StateSnapshot).Position.Tree = pcVar2;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  local_38 = &this->ExecuteCommandCallback;
  this->RecursionDepth = 0;
  (this->Defer)._M_t.
  super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
  .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl = (DeferCommands *)0x0;
  this->DeferRunning = false;
  memset(local_38,0,0xa0);
  local_a8._72_8_ = &this->LoopBlockCounter;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter,0);
  (this->cmDefineRegex).regmust = (char *)0x0;
  (this->cmDefineRegex).program = (char *)0x0;
  (this->cmDefineRegex).progsize = 0;
  memset(&this->cmDefineRegex,0,0x20a);
  (this->cmDefine01Regex).regmust = (char *)0x0;
  (this->cmDefine01Regex).program = (char *)0x0;
  (this->cmDefine01Regex).progsize = 0;
  memset(&this->cmDefine01Regex,0,0x20a);
  (this->cmAtVarRegex).regmust = (char *)0x0;
  (this->cmAtVarRegex).program = (char *)0x0;
  (this->cmAtVarRegex).progsize = 0;
  memset(&this->cmAtVarRegex,0,0x20a);
  (this->cmNamedCurly).regmust = (char *)0x0;
  (this->cmNamedCurly).program = (char *)0x0;
  (this->cmNamedCurly).progsize = 0;
  memset(&this->cmNamedCurly,0,0x20a);
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedTargetsOwned).
  super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedTargetsOwned).
  super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedTargetsOwned).
  super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedTargets)._M_h._M_buckets = &(this->ImportedTargets)._M_h._M_single_bucket;
  (this->ImportedTargets)._M_h._M_bucket_count = 1;
  (this->ImportedTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedTargets)._M_h._M_element_count = 0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GeneratorActions).
  super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratorActions).
  super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->GeneratorActions).
           super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->GeneratorActions).
           super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::cmConstStack
            (&(this->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  this->FindPackageStackNextIndex = 0;
  this->DebugFindPkg = false;
  p_Var1 = &(this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->WarnedCMP0144)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnedCMP0144)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnedCMP0144)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->WarnedCMP0144)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnedCMP0144)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnedCMP0144)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->CurrentImportedTargetScope = Local;
  this->IsSourceFileTryCompile = false;
  this->CheckSystemVars = this->GlobalGenerator->CMakeInstance->CheckSystemVars;
  this->SuppressSideEffects = false;
  std::__cxx11::string::_M_replace
            (local_a8._88_8_,0,(char *)(this->ComplainFileRegularExpression)._M_string_length,
             0x833668);
  std::__cxx11::string::_M_replace
            (local_a8._80_8_,0,(char *)(this->DefineFlags)._M_string_length,0x85d3d5);
  cmsys::RegularExpression::compile
            (&this->cmDefineRegex,"#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile
            (&this->cmDefine01Regex,"#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_00 = &this->StateSnapshot;
  this_01 = cmStateSnapshot::GetState(this_00);
  cmState::CreatePolicyScopeSnapshot((cmStateSnapshot *)local_b8,this_01,this_00);
  (this->StateSnapshot).Position.Position = local_a8._0_8_;
  this_00->State = (cmState *)local_b8._0_8_;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_b8._8_8_;
  local_a8._32_8_ = (_Base_ptr)0x0;
  local_a8._40_8_ = 0;
  local_a8._16_8_ = (_Base_ptr)0x0;
  local_a8._24_8_ = (_Base_ptr)0x0;
  local_a8._0_8_ = 0;
  local_a8._8_8_ = 0;
  local_b8._0_8_ = (cmState *)0x0;
  local_b8._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  cmStateSnapshot::PushPolicy(this_00,(PolicyMap *)local_b8,false);
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_a8._72_8_,(int *)local_b8);
  this->CheckCMP0000 = false;
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
  AddSourceGroup(this,(string *)local_b8,"^.*$");
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Source Files","");
  AddSourceGroup(this,(string *)local_b8,
                 "\\.(C|F|M|c|c\\+\\+|cc|cpp|mpp|cxx|ixx|cppm|ccm|cxxm|c\\+\\+m|cu|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$"
                );
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Header Files","");
  AddSourceGroup(this,(string *)local_b8,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Precompile Header File","");
  AddSourceGroup(this,(string *)local_b8,"cmake_pch(_[^.]+)?\\.(h|hxx)$");
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CMake Rules","");
  AddSourceGroup(this,(string *)local_b8,"\\.rule$");
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Resources","");
  AddSourceGroup(this,(string *)local_b8,"\\.(pdf|plist|png|jpeg|jpg|storyboard|xcassets)$");
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  local_b8._0_8_ = (cmState *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Object Files","");
  AddSourceGroup(this,(string *)local_b8,"\\.(lo|o|obj)$");
  if ((cmState *)local_b8._0_8_ != (cmState *)local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
  }
  this->ObjectLibrariesSourceGroupIndex =
       ((long)(this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_start >> 6) * 0x2e8ba2e8ba2e8ba3;
  std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
  emplace_back<char_const(&)[17],char_const(&)[19]>
            ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)local_a8._64_8_,
             (char (*) [17])"Object Libraries",(char (*) [19])"^MATCH_NO_SOURCES$");
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmStateSnapshot const& snapshot)
  : GlobalGenerator(globalGenerator)
  , StateSnapshot(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressSideEffects = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot =
    this->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
      this->StateSnapshot);

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if !defined(CMAKE_BOOTSTRAP)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup("Source Files", CM_SOURCE_REGEX);
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("Precompile Header File", CM_PCH_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", CM_RESOURCE_REGEX);
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");

  this->ObjectLibrariesSourceGroupIndex = this->SourceGroups.size();
  this->SourceGroups.emplace_back("Object Libraries", "^MATCH_NO_SOURCES$");
#endif
}